

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbo.cpp
# Opt level: O0

void __thiscall vera::Vbo::addIndices(Vbo *this,GLuint *_indices,int _nIndices)

{
  ostream *this_00;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  const_iterator local_28;
  int local_1c;
  GLuint *pGStack_18;
  int _nIndices_local;
  GLuint *_indices_local;
  Vbo *this_local;
  
  local_1c = _nIndices;
  pGStack_18 = _indices;
  _indices_local = (GLuint *)this;
  if ((this->m_isUploaded & 1U) == 0) {
    local_30._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->m_indices);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_28,&local_30);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::insert<unsigned_int*,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_indices,local_28,
               pGStack_18,pGStack_18 + local_1c);
    this->m_nIndices = local_1c + this->m_nIndices;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Vbo cannot add indices after upload!");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Vbo::addIndices(INDEX_TYPE_GL* _indices, int _nIndices) {
    if (m_isUploaded) {
        std::cout << "Vbo cannot add indices after upload!" << std::endl;
        return;
    }

    // if (m_nVertices >= MAX_INDEX_VALUE) {
    //     std::cout << "WARNING: Vertex buffer full, not adding indices" << std::endl;
    //     return;
    // }

    m_indices.insert(m_indices.end(), _indices, _indices + _nIndices);
    m_nIndices += _nIndices;
}